

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cpp
# Opt level: O0

string * __thiscall Array::asString_abi_cxx11_(string *__return_storage_ptr__,Array *this)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  __shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_50;
  ptr<Value> *value;
  iterator __end1;
  iterator __begin1;
  element_type *__range1;
  allocator<char> local_1a;
  undefined1 local_19;
  Array *local_18;
  Array *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Array *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"[",&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  this_00 = std::
            __shared_ptr_access<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->values);
  __end1 = std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::begin
                     (this_00);
  value = (ptr<Value> *)
          std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::end
                    (this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<Value>_*,_std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>_>
                                     *)&value), bVar1) {
    local_50 = (__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Value>_*,_std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>_>
               ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (local_50);
    (*(peVar2->super_Member)._vptr_Member[2])(&local_90);
    std::operator+(&local_70,&local_90,", ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Value>_*,_std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
  return __return_storage_ptr__;
}

Assistant:

std::string Array::asString() {
    std::string result = "[";

    for(ptr<Value>& value : *values) {
        result += value -> asString() + ", ";
    }

    result.pop_back();
    result.pop_back();

    result += "]";

    return result;
}